

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaJsonWriter::WriteIndent(VmaJsonWriter *this,bool oneLess)

{
  size_t sVar1;
  VmaVector<char,_VmaStlAllocator<char>_> *this_00;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  
  sVar1 = (this->m_Stack).m_Count;
  if ((sVar1 != 0) && ((this->m_Stack).m_pArray[sVar1 - 1].singleLineMode == false)) {
    this_00 = &this->m_SB->m_Data;
    sVar1 = this_00->m_Count;
    VmaVector<char,_VmaStlAllocator<char>_>::resize(this_00,sVar1 + 1);
    this_00->m_pArray[sVar1] = '\n';
    uVar2 = (this->m_Stack).m_Count;
    if (uVar2 != oneLess && uVar2 != 0) {
      uVar4 = 1;
      do {
        VmaStringBuilder::Add(this->m_SB,"  ");
        if (uVar2 == 0) {
          return;
        }
        bVar3 = uVar4 < uVar2 - oneLess;
        uVar4 = uVar4 + 1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

size_t size() const { return m_Count; }